

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysextest.cpp
# Opt level: O3

void mycallback(double deltatime,vector<unsigned_char,_std::allocator<unsigned_char>_> *message,
               void *param_3)

{
  pointer puVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  RtMidi *rtmidi;
  RtMidiIn *rtmidi_00;
  undefined8 uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vStack_b0;
  long *aplStack_98 [2];
  long alStack_88 [2];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvStack_78;
  ostream *poStack_70;
  ulong uStack_68;
  ulong uStack_60;
  undefined8 *puStack_58;
  code *pcStack_50;
  ulong local_40;
  double local_38;
  
  local_40 = (long)(message->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(message->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
  if ((int)local_40 != 0) {
    uVar8 = local_40 & 0xffffffff;
    uVar10 = 0;
    local_38 = deltatime;
    do {
      pcStack_50 = (code *)0x1023ec;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Byte ",5);
      pcStack_50 = (code *)0x1023f7;
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      pcStack_50 = (code *)0x10240e;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
      puVar1 = (message->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(message->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                        ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1) <= uVar10) {
        iVar4 = 0x10317a;
        pcStack_50 = main;
        uVar7 = uVar10;
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        pcStack_50 = (code *)0x10305b;
        puStack_58 = &std::cout;
        vStack_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        vStack_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pvStack_78 = message;
        poStack_70 = poVar5;
        uStack_68 = uVar8;
        uStack_60 = uVar10;
        if (iVar4 != 2) goto LAB_0010271c;
        iVar4 = atoi(*(char **)(uVar7 + 8));
        rtmidi = (RtMidi *)operator_new(0x10);
        aplStack_98[0] = alStack_88;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)aplStack_98,"RtMidi Output Client","");
        RtMidiOut::RtMidiOut((RtMidiOut *)rtmidi,0,aplStack_98);
        if (aplStack_98[0] != alStack_88) {
          operator_delete(aplStack_98[0],alStack_88[0] + 1);
        }
        rtmidi_00 = (RtMidiIn *)operator_new(0x10);
        aplStack_98[0] = alStack_88;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)aplStack_98,"RtMidi Input Client","");
        RtMidiIn::RtMidiIn(rtmidi_00,0,aplStack_98,100);
        if (aplStack_98[0] != alStack_88) {
          operator_delete(aplStack_98[0],alStack_88[0] + 1);
        }
        (**(code **)(**(long **)(rtmidi_00 + 8) + 0x58))(*(long **)(rtmidi_00 + 8),0,1,1);
        bVar3 = chooseMidiPort((RtMidi *)rtmidi_00);
        if ((!bVar3) || (bVar3 = chooseMidiPort(rtmidi), !bVar3)) goto LAB_001026cd;
        MidiInApi::setCallback
                  (*(_func_void_double_vector_ptr_void_ptr **)(rtmidi_00 + 8),mycallback);
        aplStack_98[0] = (long *)CONCAT71(aplStack_98[0]._1_7_,0xf6);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (&vStack_b0,(uchar *)aplStack_98);
        if (vStack_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            vStack_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
          (**(code **)(**(long **)(rtmidi + 8) + 0x58))();
          usleep(500000);
          bVar3 = true;
          while( true ) {
            if (vStack_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                vStack_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start) {
              vStack_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   vStack_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
            }
            aplStack_98[0] = (long *)CONCAT71(aplStack_98[0]._1_7_,0xf0);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                      (&vStack_b0,(uchar *)aplStack_98);
            if (iVar4 != 0) {
              iVar9 = 0;
              do {
                aplStack_98[0] =
                     (long *)(CONCAT71(aplStack_98[0]._1_7_,(char)iVar9) & 0xffffffffffffff7f);
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                emplace_back<unsigned_char>(&vStack_b0,(uchar *)aplStack_98);
                iVar9 = iVar9 + 1;
              } while (iVar4 != iVar9);
            }
            aplStack_98[0] = (long *)CONCAT71(aplStack_98[0]._1_7_,0xf7);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                      (&vStack_b0,(uchar *)aplStack_98);
            if (vStack_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                vStack_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start) break;
            (**(code **)(**(long **)(rtmidi + 8) + 0x58))();
            usleep(500000);
            bVar2 = !bVar3;
            bVar3 = false;
            if (bVar2) {
LAB_001026cd:
              (**(code **)(*(long *)rtmidi + 0x40))(rtmidi);
              if (rtmidi_00 != (RtMidiIn *)0x0) {
                (**(code **)(*(long *)rtmidi_00 + 0x40))(rtmidi_00);
              }
              if (vStack_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(vStack_b0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)vStack_b0.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)vStack_b0.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              return;
            }
          }
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0);
LAB_0010271c:
          usage();
        }
        uVar6 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,0);
        if (vStack_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(vStack_b0.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)vStack_b0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)vStack_b0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        _Unwind_Resume(uVar6);
      }
      pcStack_50 = (code *)0x10242e;
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(uint)puVar1[uVar10]);
      pcStack_50 = (code *)0x10243e;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      uVar10 = uVar10 + 1;
    } while (uVar8 != uVar10);
    if ((int)local_40 != 0) {
      pcStack_50 = (code *)0x102468;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"stamp = ",8);
      pcStack_50 = (code *)0x102476;
      poVar5 = std::ostream::_M_insert<double>(local_38);
      pcStack_50 = (code *)0x10248d;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      pcStack_50 = (code *)0x102498;
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      return;
    }
  }
  return;
}

Assistant:

void mycallback( double deltatime, std::vector< unsigned char > *message, void * /*userData*/ )
{
  unsigned int nBytes = message->size();
  for ( unsigned int i=0; i<nBytes; i++ )
    std::cout << "Byte " << i << " = " << (int)message->at(i) << ", ";
  if ( nBytes > 0 )
    std::cout << "stamp = " << deltatime << std::endl;
}